

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_scalar_by_extension
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,char *filename)

{
  REF_CELL pRVar1;
  REF_NODE pRVar2;
  REF_DBL *pRVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  REF_STATUS RVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  FILE *pFVar11;
  long lVar12;
  void *pvVar13;
  void *pvVar14;
  undefined1 uVar15;
  long lVar16;
  undefined8 uVar17;
  size_t __n;
  ulong uVar18;
  REF_STATUS ref_private_macro_code_rxs;
  ulong uVar19;
  char *pcVar20;
  REF_MPI pRVar21;
  ulong uVar22;
  undefined8 *puVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  REF_LONG ncell;
  REF_GLOB *l2c;
  int length;
  REF_INT min_id;
  REF_LONG ref_private_status_reis_ai;
  int version;
  int dim;
  REF_GLOB nnode;
  int local_168;
  undefined4 uStack_164;
  uint local_160;
  undefined4 uStack_15c;
  REF_INT local_158;
  uint local_154;
  REF_DBL *local_150;
  void *local_148;
  FILE *local_140;
  uint local_134;
  ulong local_130;
  void *local_128;
  REF_MPI local_120;
  long local_118;
  ulong local_110;
  size_t local_108;
  int local_fc;
  int local_f8;
  uint local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined8 *local_e8;
  long local_e0;
  void *local_d8;
  ulong local_d0;
  size_t local_c8;
  size_t local_c0;
  long local_b8;
  int local_ac;
  REF_GLOB local_a8;
  undefined1 local_a0;
  
  uVar19 = (ulong)(uint)ldim;
  local_150 = scalar;
  sVar10 = strlen(filename);
  if ((sVar10 < 10) || (iVar4 = strcmp(filename + (sVar10 - 9),"-edge.tec"), iVar4 != 0)) {
    if ((10 < sVar10) && (iVar4 = strcmp(filename + (sVar10 - 10),"-brick.plt"), iVar4 == 0)) {
      uVar5 = ref_gather_scalar_plt(ref_grid,ldim,local_150,scalar_names,1,filename);
      if (uVar5 == 0) {
        return 0;
      }
      pcVar20 = "scalar tec";
      uVar17 = 0x111e;
      goto LAB_0013ea9a;
    }
    if (sVar10 < 5) {
LAB_0013c0f7:
      if ((sVar10 < 3) || (iVar4 = strcmp(filename + (sVar10 - 2),".t"), iVar4 != 0)) {
        if (4 < sVar10) {
          iVar4 = strcmp(filename + (sVar10 - 4),".pcd");
          if (iVar4 == 0) {
            pRVar2 = ref_grid->node;
            uVar5 = ref_node_synchronize_globals(pRVar2);
            if (uVar5 == 0) {
              if (ref_grid->mpi->id == 0) {
                pFVar11 = fopen(filename,"w");
                if (pFVar11 == (FILE *)0x0) {
                  printf("unable to open %s\n",filename);
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xd0e,"ref_gather_scalar_pcd","unable to open file");
                  uVar5 = 2;
                  goto LAB_0013de49;
                }
                fwrite("# .PCD v.7 - Point Cloud Data file format\n",0x2a,1,pFVar11);
                fwrite("VERSION .7\n",0xb,1,pFVar11);
                fwrite("FIELDS x y z",0xc,1,pFVar11);
                if (scalar_names == (char **)0x0) {
                  if (0 < ldim) {
                    uVar5 = 1;
                    do {
                      fprintf(pFVar11," V%d",(ulong)uVar5);
                      iVar4 = (1 - ldim) + uVar5;
                      uVar5 = uVar5 + 1;
                    } while (iVar4 != 1);
                  }
                }
                else if (0 < ldim) {
                  uVar18 = 0;
                  do {
                    fprintf(pFVar11," %s",scalar_names[uVar18]);
                    uVar18 = uVar18 + 1;
                  } while (uVar19 != uVar18);
                }
                fputc(10,pFVar11);
                fwrite("SIZE",4,1,pFVar11);
                iVar4 = ldim + 3;
                if (ldim < -2) {
                  fputc(10,pFVar11);
                  fwrite("TYPE",4,1,pFVar11);
LAB_0013dbc8:
                  fputc(10,pFVar11);
                  fwrite("COUNT",5,1,pFVar11);
                  if (-3 < ldim) {
                    iVar8 = 1;
                    if (1 < iVar4) {
                      iVar8 = iVar4;
                    }
                    do {
                      fwrite(" 1",2,1,pFVar11);
                      iVar8 = iVar8 + -1;
                    } while (iVar8 != 0);
                  }
                }
                else {
                  iVar8 = 1;
                  if (1 < iVar4) {
                    iVar8 = iVar4;
                  }
                  do {
                    fwrite(" 4",2,1,pFVar11);
                    iVar8 = iVar8 + -1;
                  } while (iVar8 != 0);
                  fputc(10,pFVar11);
                  fwrite("TYPE",4,1,pFVar11);
                  if (-3 < ldim) {
                    iVar8 = 1;
                    if (1 < iVar4) {
                      iVar8 = iVar4;
                    }
                    do {
                      fwrite(" F",2,1,pFVar11);
                      iVar8 = iVar8 + -1;
                    } while (iVar8 != 0);
                    goto LAB_0013dbc8;
                  }
                  fputc(10,pFVar11);
                  fwrite("COUNT",5,1,pFVar11);
                }
                fputc(10,pFVar11);
                fprintf(pFVar11,"WIDTH %ld\n",pRVar2->old_n_global);
                fwrite("VIEWPOINT 0 0 0 1 0 0 0\n",0x18,1,pFVar11);
                fprintf(pFVar11,"POINTS %ld\n",pRVar2->old_n_global);
                fwrite("DATA ascii\n",0xb,1,pFVar11);
              }
              else {
                pFVar11 = (FILE *)0x0;
              }
              uVar5 = ref_gather_node_scalar_txt(pRVar2,ldim,local_150," ",1,(FILE *)pFVar11);
              if (uVar5 == 0) {
                uVar5 = 0;
                if (ref_grid->mpi->id == 0) {
                  fclose(pFVar11);
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xd28,"ref_gather_scalar_pcd",(ulong)uVar5,"text export");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xd08,"ref_gather_scalar_pcd",(ulong)uVar5,"sync");
            }
LAB_0013de49:
            if (uVar5 == 0) {
              return 0;
            }
            pcVar20 = "scalar pcd";
            uVar17 = 0x1132;
            goto LAB_0013ea9a;
          }
          iVar4 = strcmp(filename + (sVar10 - 4),".rst");
          if (iVar4 == 0) {
            pRVar21 = ref_grid->mpi;
            pRVar2 = ref_grid->node;
            uVar5 = ref_node_synchronize_globals(pRVar2);
            if (uVar5 == 0) {
              local_168 = 2;
              local_160 = ldim / 2;
              uVar6 = ldim - (ldim >> 0x1f) & 0xfffffffe;
              if (uVar6 == ldim) {
                local_154 = (uint)pRVar2->old_n_global;
                if (ref_grid->mpi->id == 0) {
                  local_158 = 8;
                  local_a8 = 0x5453524546464f43;
                  local_a0 = 0;
                  local_ec = 2;
                  local_f0 = 0;
                  pFVar11 = fopen(filename,"w");
                  local_120 = pRVar21;
                  if (pFVar11 == (FILE *)0x0) {
                    bVar24 = false;
                    printf("unable to open %s\n",filename);
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x61d,"ref_gather_scalar_rst","unable to open file");
                    uVar5 = 2;
                  }
                  else {
                    sVar10 = fwrite(&local_158,4,1,pFVar11);
                    if (sVar10 == 1) {
                      __n = (size_t)local_158;
                      local_140 = pFVar11;
                      sVar10 = fwrite(&local_a8,1,__n,pFVar11);
                      pFVar11 = local_140;
                      if (sVar10 != __n) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x621,"ref_gather_scalar_rst","magic",__n,sVar10);
LAB_0013e4fc:
                        uVar5 = 1;
                        bVar24 = false;
                        pFVar11 = local_140;
                        goto LAB_0013e508;
                      }
                      sVar10 = fwrite(&local_ec,4,1,local_140);
                      if (sVar10 == 1) {
                        local_ac = (ref_grid->twod == 0) + 2;
                        sVar10 = fwrite(&local_ac,4,1,pFVar11);
                        if (sVar10 == 1) {
                          sVar10 = fwrite(&local_160,4,1,pFVar11);
                          if (sVar10 == 1) {
                            sVar10 = fwrite(&local_168,4,1,local_140);
                            if (sVar10 == 1) {
                              sVar10 = fwrite(&local_154,4,1,local_140);
                              pFVar11 = local_140;
                              if (sVar10 == 1) {
                                sVar10 = fwrite(&local_f0,4,1,local_140);
                                bVar24 = sVar10 == 1;
                                if (!bVar24) {
                                  bVar24 = false;
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                         ,0x629,"ref_gather_scalar_rst","doubles",1,sVar10);
                                  uVar5 = 1;
                                }
                                goto LAB_0013e508;
                              }
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x628,"ref_gather_scalar_rst","dof",1,sVar10);
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x627,"ref_gather_scalar_rst","steps",1,sVar10);
                            }
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x626,"ref_gather_scalar_rst","variables",1,sVar10);
                          }
                          goto LAB_0013e4fc;
                        }
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x625,"ref_gather_scalar_rst","dim",1,sVar10);
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x622,"ref_gather_scalar_rst","version",1,sVar10);
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x61f,"ref_gather_scalar_rst","length",1,sVar10);
                    }
                    uVar5 = 1;
                    bVar24 = false;
                  }
LAB_0013e508:
                  pRVar21 = local_120;
                  if (!bVar24) goto LAB_0013ea74;
                }
                else {
                  pFVar11 = (FILE *)0x0;
                  uVar5 = 0;
                }
                uVar6 = (int)(pRVar2->old_n_global / (long)pRVar21->n) + 1;
                iVar4 = pRVar21->reduce_byte_limit;
                iVar8 = 0x7fffffff;
                if (0 < iVar4) {
                  iVar8 = iVar4 / (int)(local_160 * 8 + 8);
                }
                uVar9 = 0x7fffffff;
                if ((int)uVar6 < iVar8) {
                  uVar9 = uVar6;
                }
                if ((0 < iVar4) && (iVar8 <= (int)uVar6)) {
                  uVar9 = iVar4 / (int)(local_160 * 8 + 8);
                }
                lVar12 = (long)(int)local_160;
                uVar19 = lVar12 + 1;
                iVar4 = (int)uVar19;
                uVar6 = iVar4 * uVar9;
                if ((int)uVar6 < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x631,"ref_gather_scalar_rst","malloc local_xyzm of REF_DBL negative");
                  uVar5 = 1;
                }
                else {
                  sVar10 = (ulong)uVar6 << 3;
                  local_140 = pFVar11;
                  local_134 = uVar9;
                  local_130 = (ulong)local_160;
                  local_f4 = uVar6;
                  local_148 = malloc(sVar10);
                  if (local_148 == (void *)0x0) {
                    pcVar20 = "malloc local_xyzm of REF_DBL NULL";
                    uVar17 = 0x631;
                  }
                  else {
                    local_108 = sVar10;
                    local_128 = malloc(sVar10);
                    if (local_128 != (void *)0x0) {
                      local_fc = local_168;
                      pFVar11 = local_140;
                      if (0 < local_168) {
                        local_e0 = (long)(int)local_134;
                        local_c0 = (uVar19 & 0xffffffff) << 3;
                        local_c8 = local_130 * 8;
                        local_e8 = (undefined8 *)((long)local_148 + lVar12 * 8);
                        local_d8 = (void *)((long)local_128 + lVar12 * 8);
                        local_b8 = lVar12 * 8 + 8;
                        iVar8 = 0;
                        uVar6 = local_134;
                        local_120 = pRVar21;
                        do {
                          lVar12 = pRVar2->old_n_global;
                          local_f8 = iVar8;
                          if (0 < lVar12) {
                            lVar16 = 0;
                            uVar9 = uVar5;
                            do {
                              uVar18 = lVar12 - lVar16 & 0xffffffff;
                              if (local_e0 < lVar12 - lVar16) {
                                uVar18 = (ulong)uVar6;
                              }
                              local_118 = lVar16;
                              if (local_f4 != 0) {
                                memset(local_148,0,local_108);
                              }
                              local_110 = uVar18;
                              local_d0 = uVar18;
                              if (0 < (int)uVar18) {
                                uVar22 = 0;
                                lVar12 = local_118;
                                puVar23 = local_e8;
                                uVar5 = uVar9;
                                do {
                                  uVar6 = ref_node_local(pRVar2,lVar12,(REF_INT *)&local_a8);
                                  if ((uVar6 != 0) && (uVar6 != 5)) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                           ,0x642,"ref_gather_scalar_rst",(ulong)uVar6,
                                           "node local failed");
                                    uVar5 = uVar6;
                                  }
                                  pvVar14 = (void *)((long)local_148 + uVar22 * 8);
                                  if (uVar6 == 5) {
LAB_0013e7ae:
                                    if (-1 < (int)local_130) {
                                      memset(pvVar14,0,local_c0);
                                    }
                                  }
                                  else {
                                    if (uVar6 != 0) goto LAB_0013ea74;
                                    if (local_120->id != pRVar2->part[(int)local_a8])
                                    goto LAB_0013e7ae;
                                    if (0 < (int)local_130) {
                                      memcpy(pvVar14,local_150 + (long)(int)local_a8 * (long)ldim,
                                             local_c8);
                                    }
                                    *puVar23 = 0x3ff0000000000000;
                                  }
                                  puVar23 = (undefined8 *)((long)puVar23 + local_b8);
                                  lVar12 = lVar12 + 1;
                                  uVar22 = (ulong)(uint)((int)uVar22 + iVar4);
                                  uVar18 = uVar18 - 1;
                                  uVar9 = uVar5;
                                } while (uVar18 != 0);
                              }
                              pRVar21 = local_120;
                              uVar5 = ref_mpi_sum(local_120,local_148,local_128,
                                                  (int)local_110 * iVar4,3);
                              if (uVar5 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                       ,0x650,"ref_gather_scalar_rst",(ulong)uVar5,"sum");
                                goto LAB_0013ea74;
                              }
                              iVar8 = (int)local_110;
                              if ((0 < iVar8) && (pRVar21->id == 0)) {
                                uVar5 = 0;
                                uVar18 = 0;
                                do {
                                  dVar25 = *(double *)((long)local_d8 + uVar18 * uVar19 * 8) + -1.0;
                                  if (dVar25 <= -dVar25) {
                                    dVar25 = -dVar25;
                                  }
                                  if (0.1 < dVar25) {
                                    printf("error gather node %ld %f\n",uVar18 + local_118);
                                  }
                                  if (0 < (int)local_130) {
                                    pvVar14 = (void *)((long)local_128 + (ulong)uVar5 * 8);
                                    uVar22 = local_130;
                                    do {
                                      sVar10 = fwrite(pvVar14,8,1,local_140);
                                      if (sVar10 != 1) {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                               ,0x65c,"ref_gather_scalar_rst","s",1,sVar10);
                                        uVar5 = 1;
                                        goto LAB_0013ea74;
                                      }
                                      pvVar14 = (void *)((long)pvVar14 + 8);
                                      uVar22 = uVar22 - 1;
                                    } while (uVar22 != 0);
                                  }
                                  uVar18 = uVar18 + 1;
                                  uVar5 = uVar5 + iVar4;
                                  iVar8 = (int)local_110;
                                } while (uVar18 != local_d0);
                              }
                              lVar16 = local_118 + iVar8;
                              lVar12 = pRVar2->old_n_global;
                              pFVar11 = local_140;
                              uVar5 = uVar9;
                              uVar6 = local_134;
                            } while (lVar16 < lVar12);
                          }
                          iVar8 = local_f8 + 1;
                        } while (iVar8 != local_fc);
                      }
                      free(local_128);
                      free(local_148);
                      uVar5 = 0;
                      if (ref_grid->mpi->id == 0) {
                        fclose(pFVar11);
                      }
                      goto LAB_0013ea74;
                    }
                    pcVar20 = "malloc xyzm of REF_DBL NULL";
                    uVar17 = 0x632;
                  }
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,uVar17,"ref_gather_scalar_rst",pcVar20);
                  uVar5 = 2;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x610,"ref_gather_scalar_rst","ldim not divisble by steps",(long)ldim,
                       (long)(int)uVar6);
                uVar5 = 1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x60d,"ref_gather_scalar_rst",(ulong)uVar5,"sync");
            }
LAB_0013ea74:
            if (uVar5 == 0) {
              return 0;
            }
            pcVar20 = "scalar rst";
            uVar17 = 0x1136;
            goto LAB_0013ea9a;
          }
        }
        if ((sVar10 < 0xd) || (iVar4 = strcmp(filename + (sVar10 - 0xc),".restart_sol"), iVar4 != 0)
           ) {
          if ((sVar10 < 5) || (iVar4 = strcmp(filename + (sVar10 - 4),".sol"), iVar4 != 0)) {
            if ((0xf < sVar10) &&
               (iVar4 = strcmp(filename + (sVar10 - 0xf),"-usm3dcell.solb"), iVar4 == 0)) {
              uVar5 = ref_gather_scalar_cell_solb(ref_grid,ldim,local_150,filename);
              if (uVar5 == 0) {
                return 0;
              }
              pcVar20 = "scalar usm3d cell solb";
              uVar17 = 0x1146;
              goto LAB_0013ea9a;
            }
            if ((sVar10 < 6) || (iVar4 = strcmp(filename + (sVar10 - 5),".solb"), iVar4 != 0)) {
              if (sVar10 < 5) {
LAB_0013c22f:
                printf("%s: %d: %s %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x115c,"input file name extension unknown",filename);
                return 1;
              }
              pcVar20 = filename + (sVar10 - 4);
              iVar4 = strcmp(pcVar20,".bin");
              if (iVar4 != 0) {
                iVar4 = strcmp(pcVar20,".txt");
                if (iVar4 == 0) {
                  uVar5 = ref_gather_scalar_txt(ref_grid,ldim,local_150," ",filename);
                  if (uVar5 == 0) {
                    return 0;
                  }
                  pcVar20 = "scalar txt";
                  uVar17 = 0x1154;
                }
                else {
                  iVar4 = strcmp(pcVar20,".csv");
                  if (iVar4 != 0) goto LAB_0013c22f;
                  uVar5 = ref_gather_scalar_txt(ref_grid,ldim,local_150,",",filename);
                  if (uVar5 == 0) {
                    return 0;
                  }
                  pcVar20 = "scalar txt";
                  uVar17 = 0x1159;
                }
                goto LAB_0013ea9a;
              }
              pRVar2 = ref_grid->node;
              uVar5 = ref_node_synchronize_globals(pRVar2);
              if (uVar5 == 0) {
                if (ref_grid->mpi->id == 0) {
                  pFVar11 = fopen(filename,"w");
                  if (pFVar11 == (FILE *)0x0) {
                    printf("unable to open %s\n",filename);
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xbef,"ref_gather_scalar_bin","unable to open file");
                    uVar5 = 2;
                    goto LAB_0013e1c5;
                  }
                }
                else {
                  pFVar11 = (FILE *)0x0;
                }
                uVar5 = ref_gather_node_scalar_bin(pRVar2,ldim,local_150,(FILE *)pFVar11);
                if (uVar5 == 0) {
                  uVar5 = 0;
                  if (ref_grid->mpi->id == 0) {
                    fclose(pFVar11);
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xbf2,"ref_gather_scalar_bin",(ulong)uVar5,"nodes");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xbe9,"ref_gather_scalar_bin",(ulong)uVar5,"sync");
              }
LAB_0013e1c5:
              if (uVar5 == 0) {
                return 0;
              }
              pcVar20 = "scalar bin";
              uVar17 = 0x114f;
              goto LAB_0013ea9a;
            }
            uVar5 = ref_node_synchronize_globals(ref_grid->node);
            if (uVar5 == 0) {
              if (ref_grid->mpi->id == 0) {
                pFVar11 = fopen(filename,"w");
                if (pFVar11 == (FILE *)0x0) {
                  printf("unable to open %s\n",filename);
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xc05,"ref_gather_scalar_solb","unable to open file");
                  uVar5 = 2;
                  goto LAB_0013e4cd;
                }
              }
              else {
                pFVar11 = (FILE *)0x0;
              }
              pRVar21 = ref_grid->mpi;
              pRVar2 = ref_grid->node;
              uVar6 = ref_node_synchronize_globals(pRVar2);
              if (uVar6 == 0) {
                local_154 = (ref_grid->twod == 0) + 2;
                local_168 = 2;
                iVar4 = ref_grid->meshb_version;
                if ((ref_grid->meshb_version < 2) &&
                   (iVar4 = local_168, 10000000 < pRVar2->old_n_global)) {
                  iVar4 = (200000000 < pRVar2->old_n_global) + 3;
                }
                local_168 = iVar4;
                bVar24 = 2 < local_168;
                if (pRVar21->id == 0) {
                  local_148 = (void *)CONCAT71(local_148._1_7_,3 < local_168);
                  local_160 = 1;
                  sVar10 = fwrite(&local_160,4,1,pFVar11);
                  if (sVar10 == 1) {
                    sVar10 = fwrite(&local_168,4,1,pFVar11);
                    if (sVar10 == 1) {
                      lVar12 = ftell(pFVar11);
                      local_a8 = CONCAT44(local_a8._4_4_,3);
                      sVar10 = fwrite(&local_a8,4,1,pFVar11);
                      if (sVar10 == 1) {
                        pvVar14 = (void *)((ulong)((uint)bVar24 * 4 + 8) + lVar12 + 4);
                        uVar5 = ref_export_meshb_next_position
                                          ((FILE *)pFVar11,local_168,(REF_FILEPOS)pvVar14);
                        if (uVar5 == 0) {
                          sVar10 = fwrite(&local_154,4,1,pFVar11);
                          if (sVar10 == 1) {
                            pvVar13 = (void *)ftell(pFVar11);
                            if (pvVar14 != pvVar13) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0x73a,"ref_gather_node_scalar_solb","dim inconsistent",pvVar14
                                     ,pvVar13);
                              uVar6 = 1;
                            }
                            uVar5 = uVar6;
                            uVar15 = (byte)local_148;
                            if (pvVar14 == pvVar13) goto LAB_0013dcda;
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x739,"ref_gather_node_scalar_solb","dim",1,sVar10);
                            uVar5 = 1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x738,"ref_gather_node_scalar_solb",(ulong)uVar5,"next p");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x737,"ref_gather_node_scalar_solb","dim code",1,sVar10);
                        uVar5 = 1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x734,"ref_gather_node_scalar_solb","version",1,sVar10);
                      uVar5 = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x733,"ref_gather_node_scalar_solb","code",1,sVar10);
                    uVar5 = 1;
                  }
                }
                else {
                  pvVar14 = (void *)0x0;
                  uVar15 = 3 < local_168;
LAB_0013dcda:
                  if (pRVar21->id == 0) {
                    local_148 = (void *)CONCAT71(local_148._1_7_,uVar15);
                    lVar12 = pRVar2->old_n_global;
                    local_130 = ftell(pFVar11);
                    local_a8 = CONCAT44(local_a8._4_4_,0x3e);
                    sVar10 = fwrite(&local_a8,4,1,pFVar11);
                    iVar4 = local_168;
                    if (sVar10 == 1) {
                      local_148 = (void *)(local_130 +
                                           (long)(ldim * 4) +
                                           (ulong)((uint)bVar24 * 4 + (uint)(byte)local_148 * 4 +
                                                  0xc) + (ldim * 8) * lVar12 + 4);
                      uVar5 = ref_export_meshb_next_position
                                        ((FILE *)pFVar11,local_168,(REF_FILEPOS)local_148);
                      if (uVar5 == 0) {
                        RVar7 = ref_gather_meshb_glob((FILE *)pFVar11,iVar4,pRVar2->old_n_global);
                        if (RVar7 == 0) {
                          local_a8 = CONCAT44(local_a8._4_4_,ldim);
                          sVar10 = fwrite(&local_a8,4,1,pFVar11);
                          if (sVar10 == 1) {
                            local_a8 = CONCAT44(local_a8._4_4_,1);
                            pvVar14 = local_148;
                            if (0 < ldim) {
                              do {
                                sVar10 = fwrite(&local_a8,4,1,pFVar11);
                                if (sVar10 != 1) {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                         ,0x74b,"ref_gather_node_scalar_solb","scalar",1,sVar10);
                                  uVar5 = 1;
                                  goto LAB_0013e47c;
                                }
                                uVar5 = (int)uVar19 - 1;
                                uVar19 = (ulong)uVar5;
                                pvVar14 = local_148;
                              } while (uVar5 != 0);
                            }
                            goto LAB_0013dcee;
                          }
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x748,"ref_gather_node_scalar_solb","n solutions",1,sVar10);
                          uVar5 = 1;
                        }
                        else {
                          uVar5 = 1;
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x746,"ref_gather_node_scalar_solb",1,"nnode");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x744,"ref_gather_node_scalar_solb",(ulong)uVar5,"next p");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x743,"ref_gather_node_scalar_solb","vertex version code",1,sVar10);
                      uVar5 = 1;
                    }
                  }
                  else {
LAB_0013dcee:
                    local_148 = pvVar14;
                    uVar5 = ref_gather_node_scalar_bin(pRVar2,ldim,local_150,(FILE *)pFVar11);
                    if (uVar5 == 0) {
                      if (pRVar21->id == 0) {
                        pvVar14 = (void *)ftell(pFVar11);
                        if (local_148 != pvVar14) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x753,"ref_gather_node_scalar_solb",
                                 "solb metric record len inconsistent",local_148,pvVar14);
                          uVar6 = 1;
                        }
                        uVar5 = uVar6;
                        if (local_148 != pvVar14) goto LAB_0013e47c;
                      }
                      if (pRVar21->id == 0) {
                        local_a8 = CONCAT44(local_a8._4_4_,0x36);
                        sVar10 = fwrite(&local_a8,4,1,pFVar11);
                        if (sVar10 == 1) {
                          uVar5 = ref_export_meshb_next_position((FILE *)pFVar11,local_168,0);
                          if (uVar5 == 0) goto LAB_0013eb2f;
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x759,"ref_gather_node_scalar_solb",(ulong)uVar5,"next p");
                        }
                        else {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x757,"ref_gather_node_scalar_solb","end kw",1,sVar10);
                          uVar5 = 1;
                        }
                      }
                      else {
LAB_0013eb2f:
                        uVar5 = 0;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x750,"ref_gather_node_scalar_solb",(ulong)uVar5,"bin dump in solb");
                    }
                  }
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x71e,"ref_gather_node_scalar_solb",(ulong)uVar6,"sync");
                uVar5 = uVar6;
              }
LAB_0013e47c:
              if (uVar5 == 0) {
                uVar5 = 0;
                if (ref_grid->mpi->id == 0) {
                  fclose(pFVar11);
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xc08,"ref_gather_scalar_solb",(ulong)uVar5,"nodes");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xbff,"ref_gather_scalar_solb",(ulong)uVar5,"sync");
            }
LAB_0013e4cd:
            if (uVar5 == 0) {
              return 0;
            }
            pcVar20 = "scalar solb";
            uVar17 = 0x114b;
            goto LAB_0013ea9a;
          }
          uVar5 = ref_node_synchronize_globals(ref_grid->node);
          if (uVar5 == 0) {
            if (ref_grid->mpi->id == 0) {
              pFVar11 = fopen(filename,"w");
              if (pFVar11 == (FILE *)0x0) {
                printf("unable to open %s\n",filename);
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xc43,"ref_gather_scalar_sol","unable to open file");
                uVar5 = 2;
                goto LAB_0013dc6b;
              }
            }
            else {
              pFVar11 = (FILE *)0x0;
            }
            pRVar21 = ref_grid->mpi;
            pRVar2 = ref_grid->node;
            uVar5 = ref_node_synchronize_globals(pRVar2);
            if (uVar5 == 0) {
              if (pRVar21->id == 0) {
                iVar4 = ref_grid->twod;
                fprintf(pFVar11,"MeshVersionFormatted %d\n\n",2);
                fprintf(pFVar11,"Dimension %d\n\n",(ulong)((iVar4 == 0) + 2));
              }
              if (pRVar21->id == 0) {
                fwrite("SolAtVertices\n",0xe,1,pFVar11);
                fprintf(pFVar11,"%ld\n",pRVar2->old_n_global);
                fprintf(pFVar11,"%d",uVar19);
                if (0 < ldim) {
                  do {
                    fprintf(pFVar11," %d",1);
                    uVar5 = (int)uVar19 - 1;
                    uVar19 = (ulong)uVar5;
                  } while (uVar5 != 0);
                }
                fputc(10,pFVar11);
              }
              uVar5 = ref_gather_node_scalar_txt(pRVar2,ldim,local_150," ",0,(FILE *)pFVar11);
              if (uVar5 == 0) {
                uVar5 = 0;
                if (pRVar21->id == 0) {
                  fwrite("\nEnd\n",5,1,pFVar11);
                  uVar5 = 0;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x77f,"ref_gather_node_scalar_sol",(ulong)uVar5,"txt dump in solb");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x768,"ref_gather_node_scalar_sol",(ulong)uVar5,"sync");
            }
            if (uVar5 == 0) {
              uVar5 = 0;
              if (ref_grid->mpi->id == 0) {
                fclose(pFVar11);
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc46,"ref_gather_scalar_sol",(ulong)uVar5,"nodes");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xc3d,"ref_gather_scalar_sol",(ulong)uVar5,"sync");
          }
LAB_0013dc6b:
          if (uVar5 == 0) {
            return 0;
          }
          pcVar20 = "scalar sol";
          uVar17 = 0x1140;
          goto LAB_0013ea9a;
        }
        if (ref_grid->mpi->n < 2) {
          if (ldim != 5) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xc17,"ref_gather_scalar_cell_restart_sol","only implemented for ldim=5",5,
                   (long)ldim);
            goto LAB_0013d1b5;
          }
          pRVar1 = ref_grid->cell[3];
          pFVar11 = fopen(filename,"w");
          if (pFVar11 == (FILE *)0x0) {
            bVar24 = false;
            printf("unable to open %s\n",filename);
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xc1b,"ref_gather_scalar_cell_restart_sol","unable to open file");
            uVar5 = 2;
          }
          else {
            fprintf(pFVar11,"%d\n",(ulong)(uint)pRVar1->n);
            pRVar3 = local_150;
            if (0 < pRVar1->max) {
              iVar4 = 0;
              do {
                RVar7 = ref_cell_nodes(pRVar1,iVar4,(REF_INT *)&local_a8);
                if (RVar7 == 0) {
                  iVar8 = pRVar1->node_per;
                  if ((long)iVar8 < 1) {
                    dVar25 = 0.0;
                    dVar26 = 0.0;
                    dVar27 = 0.0;
                    dVar28 = 0.0;
                  }
                  else {
                    dVar28 = 0.0;
                    lVar12 = 0;
                    dVar27 = 0.0;
                    dVar26 = 0.0;
                    dVar25 = 0.0;
                    do {
                      lVar16 = (long)*(int *)((long)&local_a8 + lVar12 * 4);
                      dVar25 = dVar25 + pRVar3[lVar16 * 5];
                      dVar26 = dVar26 + pRVar3[lVar16 * 5 + 1];
                      dVar27 = dVar27 + pRVar3[lVar16 * 5 + 3];
                      dVar28 = dVar28 + pRVar3[lVar16 * 5 + 4];
                      lVar12 = lVar12 + 1;
                    } while (iVar8 != lVar12);
                  }
                  dVar29 = (double)iVar8;
                  fprintf(pFVar11,"%.15e %.15e %.15e %.15e\n",dVar25 / dVar29,dVar26 / dVar29,
                          dVar27 / dVar29,dVar28 / dVar29);
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < pRVar1->max);
            }
            fclose(pFVar11);
            bVar24 = true;
            uVar5 = 0;
          }
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xc16,"ref_gather_scalar_cell_restart_sol","only implemented for single core");
LAB_0013d1b5:
          bVar24 = false;
          uVar5 = 1;
        }
        if (bVar24) {
          return uVar5;
        }
        pcVar20 = "scalar sol";
        uVar17 = 0x113c;
        goto LAB_0013ea9a;
      }
    }
    else {
      pcVar20 = filename + (sVar10 - 4);
      iVar4 = strcmp(pcVar20,".plt");
      if (iVar4 == 0) {
        uVar5 = ref_gather_scalar_plt(ref_grid,ldim,local_150,scalar_names,0,filename);
        if (uVar5 == 0) {
          return 0;
        }
        pcVar20 = "scalar tec";
        uVar17 = 0x1124;
        goto LAB_0013ea9a;
      }
      iVar4 = strcmp(pcVar20,".tec");
      if ((iVar4 != 0) && (iVar4 = strcmp(pcVar20,".dat"), iVar4 != 0)) goto LAB_0013c0f7;
    }
    pRVar2 = ref_grid->node;
    if (ref_grid->mpi->id == 0) {
      pFVar11 = fopen(filename,"w");
      if (pFVar11 != (FILE *)0x0) {
        fwrite("title=\"tecplot refine gather\"\n",0x1e,1,pFVar11);
        fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,pFVar11);
        if (scalar_names == (char **)0x0) {
          if (0 < ldim) {
            uVar5 = 1;
            do {
              fprintf(pFVar11," \"V%d\"",(ulong)uVar5);
              bVar24 = uVar5 != ldim;
              uVar5 = uVar5 + 1;
            } while (bVar24);
          }
        }
        else if (0 < ldim) {
          uVar18 = 0;
          do {
            fprintf(pFVar11," \"%s\"",scalar_names[uVar18]);
            uVar18 = uVar18 + 1;
          } while (uVar19 != uVar18);
        }
        fputc(10,pFVar11);
        goto LAB_0013c84d;
      }
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xd40,"ref_gather_scalar_tec","unable to open file");
      uVar5 = 2;
    }
    else {
      pFVar11 = (FILE *)0x0;
LAB_0013c84d:
      uVar5 = ref_node_synchronize_globals(pRVar2);
      if (uVar5 == 0) {
        uVar5 = ref_grid_faceid_range(ref_grid,(REF_INT *)&local_154,&local_158);
        if (uVar5 == 0) {
          uVar6 = local_154;
          if ((int)local_154 <= local_158) {
            do {
              pRVar1 = ref_grid->cell[3];
              uVar5 = ref_grid_compact_cell_id_nodes
                                (ref_grid,pRVar1,uVar6,&local_a8,(REF_LONG *)&local_168,
                                 (REF_GLOB **)&local_160);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xd53,"ref_gather_scalar_tec",(ulong)uVar5,"l2c");
                goto LAB_0013c8dc;
              }
              if (0 < CONCAT44(uStack_164,local_168) && 0 < local_a8) {
                if (ref_grid->mpi->id == 0) {
                  fprintf(pFVar11,
                          "zone t=\"tri%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n"
                          ,(ulong)uVar6,local_a8,CONCAT44(uStack_164,local_168),"point","fetriangle"
                         );
                }
                uVar5 = ref_gather_node_tec_part
                                  (pRVar2,local_a8,(REF_GLOB *)CONCAT44(uStack_15c,local_160),ldim,
                                   local_150,(FILE *)pFVar11);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xd5d,"ref_gather_scalar_tec",(ulong)uVar5);
                  goto LAB_0013c8dc;
                }
                uVar5 = ref_gather_cell_id_tec
                                  (pRVar2,pRVar1,uVar6,CONCAT44(uStack_164,local_168),
                                   (REF_GLOB *)CONCAT44(uStack_15c,local_160),0,(FILE *)pFVar11);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xd60,"ref_gather_scalar_tec",(ulong)uVar5,"t");
                  goto LAB_0013c8dc;
                }
              }
              if ((void *)CONCAT44(uStack_15c,local_160) != (void *)0x0) {
                free((void *)CONCAT44(uStack_15c,local_160));
              }
              pRVar1 = ref_grid->cell[6];
              uVar5 = ref_grid_compact_cell_id_nodes
                                (ref_grid,pRVar1,uVar6,&local_a8,(REF_LONG *)&local_168,
                                 (REF_GLOB **)&local_160);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xd67,"ref_gather_scalar_tec",(ulong)uVar5,"l2c");
                goto LAB_0013c8dc;
              }
              if (0 < CONCAT44(uStack_164,local_168) && 0 < local_a8) {
                if (ref_grid->mpi->id == 0) {
                  fprintf(pFVar11,
                          "zone t=\"quad%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n"
                          ,(ulong)uVar6,local_a8,CONCAT44(uStack_164,local_168),"point",
                          "fequadrilateral");
                }
                uVar5 = ref_gather_node_tec_part
                                  (pRVar2,local_a8,(REF_GLOB *)CONCAT44(uStack_15c,local_160),ldim,
                                   local_150,(FILE *)pFVar11);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xd71,"ref_gather_scalar_tec",(ulong)uVar5);
                  goto LAB_0013c8dc;
                }
                uVar5 = ref_gather_cell_id_tec
                                  (pRVar2,pRVar1,uVar6,CONCAT44(uStack_164,local_168),
                                   (REF_GLOB *)CONCAT44(uStack_15c,local_160),0,(FILE *)pFVar11);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xd74,"ref_gather_scalar_tec",(ulong)uVar5,"t");
                  goto LAB_0013c8dc;
                }
              }
              if ((void *)CONCAT44(uStack_15c,local_160) != (void *)0x0) {
                free((void *)CONCAT44(uStack_15c,local_160));
              }
              bVar24 = (int)uVar6 < local_158;
              uVar6 = uVar6 + 1;
            } while (bVar24);
          }
          pRVar1 = ref_grid->cell[8];
          uVar5 = ref_grid_compact_cell_nodes
                            (ref_grid,pRVar1,&local_a8,(REF_LONG *)&local_168,
                             (REF_GLOB **)&local_160);
          if (uVar5 == 0) {
            if (CONCAT44(uStack_164,local_168) < 1 || local_a8 < 1) {
LAB_0013ca7e:
              if ((void *)CONCAT44(uStack_15c,local_160) != (void *)0x0) {
                free((void *)CONCAT44(uStack_15c,local_160));
              }
              uVar5 = 0;
              if (ref_grid->mpi->id == 0) {
                fclose(pFVar11);
              }
            }
            else {
              if (ref_grid->mpi->id == 0) {
                fprintf(pFVar11,
                        "zone t=\"tet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                        local_a8,CONCAT44(uStack_164,local_168),"point","fetetrahedron");
              }
              uVar5 = ref_gather_node_tec_part
                                (pRVar2,local_a8,(REF_GLOB *)CONCAT44(uStack_15c,local_160),ldim,
                                 local_150,(FILE *)pFVar11);
              if (uVar5 == 0) {
                uVar5 = ref_gather_cell_tec(pRVar2,pRVar1,CONCAT44(uStack_164,local_168),
                                            (REF_GLOB *)CONCAT44(uStack_15c,local_160),0,
                                            (FILE *)pFVar11);
                if (uVar5 == 0) goto LAB_0013ca7e;
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xd87,"ref_gather_scalar_tec",(ulong)uVar5,"t");
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xd85,"ref_gather_scalar_tec",(ulong)uVar5,"nodes");
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xd7b,"ref_gather_scalar_tec",(ulong)uVar5,"l2c");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xd4d,"ref_gather_scalar_tec",(ulong)uVar5,"range");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xd4b,"ref_gather_scalar_tec",(ulong)uVar5,"sync");
      }
    }
LAB_0013c8dc:
    if (uVar5 == 0) {
      return 0;
    }
    pcVar20 = "scalar tec";
    uVar17 = 0x112d;
    goto LAB_0013ea9a;
  }
  pRVar21 = ref_grid->mpi;
  pRVar2 = ref_grid->node;
  if (pRVar21->id == 0) {
    pFVar11 = fopen(filename,"w");
    if (pFVar11 != (FILE *)0x0) {
      fwrite("title=\"tecplot refine gather\"\n",0x1e,1,pFVar11);
      fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,pFVar11);
      if (scalar_names == (char **)0x0) {
        if (0 < ldim) {
          uVar5 = 1;
          do {
            fprintf(pFVar11," \"V%d\"",(ulong)uVar5);
            iVar4 = (1 - ldim) + uVar5;
            uVar5 = uVar5 + 1;
          } while (iVar4 != 1);
        }
      }
      else if (0 < ldim) {
        uVar18 = 0;
        do {
          fprintf(pFVar11," \"%s\"",scalar_names[uVar18]);
          uVar18 = uVar18 + 1;
        } while (uVar19 != uVar18);
      }
      fputc(10,pFVar11);
      goto LAB_0013ce0e;
    }
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xda1,
           "ref_gather_scalar_edge_tec","unable to open file");
    uVar5 = 2;
  }
  else {
    pFVar11 = (FILE *)0x0;
LAB_0013ce0e:
    uVar5 = ref_node_synchronize_globals(pRVar2);
    if (uVar5 == 0) {
      pRVar1 = ref_grid->cell[0];
      uVar5 = ref_cell_id_range(pRVar1,pRVar21,(REF_INT *)&local_154,&local_158);
      if (uVar5 == 0) {
        uVar6 = local_154;
        if ((int)local_154 <= local_158) {
          do {
            uVar5 = ref_grid_compact_cell_id_nodes
                              (ref_grid,pRVar1,uVar6,&local_a8,(REF_LONG *)&local_168,
                               (REF_GLOB **)&local_160);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xdb4,"ref_gather_scalar_edge_tec",(ulong)uVar5,"l2c");
              goto LAB_0013ceae;
            }
            if (0 < CONCAT44(uStack_164,local_168) && 0 < local_a8) {
              if (ref_grid->mpi->id == 0) {
                fprintf(pFVar11,
                        "zone t=\"edg%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                        (ulong)uVar6,local_a8,CONCAT44(uStack_164,local_168),"point","felineseg");
              }
              uVar5 = ref_gather_node_tec_part
                                (pRVar2,local_a8,(REF_GLOB *)CONCAT44(uStack_15c,local_160),ldim,
                                 local_150,(FILE *)pFVar11);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xdbe,"ref_gather_scalar_edge_tec",(ulong)uVar5);
                goto LAB_0013ceae;
              }
              uVar5 = ref_gather_cell_id_tec
                                (pRVar2,pRVar1,uVar6,CONCAT44(uStack_164,local_168),
                                 (REF_GLOB *)CONCAT44(uStack_15c,local_160),0,(FILE *)pFVar11);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xdc1,"ref_gather_scalar_edge_tec",(ulong)uVar5,"t");
                goto LAB_0013ceae;
              }
            }
            if ((void *)CONCAT44(uStack_15c,local_160) != (void *)0x0) {
              free((void *)CONCAT44(uStack_15c,local_160));
            }
            bVar24 = (int)uVar6 < local_158;
            uVar6 = uVar6 + 1;
          } while (bVar24);
        }
        uVar5 = 0;
        if (ref_grid->mpi->id == 0) {
          fclose(pFVar11);
          uVar5 = 0;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xdaf,"ref_gather_scalar_edge_tec",(ulong)uVar5,"range");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xdac,"ref_gather_scalar_edge_tec",(ulong)uVar5,"sync");
    }
  }
LAB_0013ceae:
  if (uVar5 == 0) {
    return 0;
  }
  pcVar20 = "scalar edge tec";
  uVar17 = 0x1117;
LAB_0013ea9a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar17,
         "ref_gather_scalar_by_extension",(ulong)uVar5,pcVar20);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_by_extension(REF_GRID ref_grid,
                                                  REF_INT ldim, REF_DBL *scalar,
                                                  const char **scalar_names,
                                                  const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], "-edge.tec") == 0) {
    RSS(ref_gather_scalar_edge_tec(ref_grid, ldim, scalar, scalar_names,
                                   filename),
        "scalar edge tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], "-brick.plt") == 0) {
    RSS(ref_gather_scalar_plt(ref_grid, ldim, scalar, scalar_names, REF_TRUE,
                              filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_gather_scalar_plt(ref_grid, ldim, scalar, scalar_names, REF_FALSE,
                              filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if ((end_of_string > 4 &&
       strcmp(&filename[end_of_string - 4], ".tec") == 0) ||
      (end_of_string > 4 &&
       strcmp(&filename[end_of_string - 4], ".dat") == 0) ||
      (end_of_string > 2 && strcmp(&filename[end_of_string - 2], ".t") == 0)) {
    RSS(ref_gather_scalar_tec(ref_grid, ldim, scalar, scalar_names, filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".pcd") == 0) {
    RSS(ref_gather_scalar_pcd(ref_grid, ldim, scalar, scalar_names, filename),
        "scalar pcd");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".rst") == 0) {
    RSS(ref_gather_scalar_rst(ref_grid, ldim, scalar, filename), "scalar rst");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".restart_sol") == 0) {
    RSS(ref_gather_scalar_cell_restart_sol(ref_grid, ldim, scalar, filename),
        "scalar sol");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".sol") == 0) {
    RSS(ref_gather_scalar_sol(ref_grid, ldim, scalar, filename), "scalar sol");
    return REF_SUCCESS;
  }
  if (end_of_string > 15 &&
      strcmp(&filename[end_of_string - 15], "-usm3dcell.solb") == 0) {
    RSS(ref_gather_scalar_cell_solb(ref_grid, ldim, scalar, filename),
        "scalar usm3d cell solb");
    return REF_SUCCESS;
  }
  if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0) {
    RSS(ref_gather_scalar_solb(ref_grid, ldim, scalar, filename),
        "scalar solb");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".bin") == 0) {
    RSS(ref_gather_scalar_bin(ref_grid, ldim, scalar, filename), "scalar bin");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".txt") == 0) {
    RSS(ref_gather_scalar_txt(ref_grid, ldim, scalar, " ", filename),
        "scalar txt");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".csv") == 0) {
    RSS(ref_gather_scalar_txt(ref_grid, ldim, scalar, ",", filename),
        "scalar txt");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  return REF_FAILURE;
}